

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sstring_view.cpp
# Opt level: O0

void __thiscall
SStringViewRelational_Eq_Test<const_(anonymous_namespace)::sstringview_maker>::TestBody
          (SStringViewRelational_Eq_Test<const_(anonymous_namespace)::sstringview_maker> *this)

{
  bool bVar1;
  char *pcVar2;
  AssertHelper local_920;
  Message local_918;
  bool local_909;
  sstringview_maker local_908;
  bool local_8f1;
  undefined1 local_8f0 [8];
  AssertionResult gtest_ar_31;
  Message local_8d8;
  bool local_8c9;
  sstringview_maker local_8c8;
  bool local_8b1;
  undefined1 local_8b0 [8];
  AssertionResult gtest_ar_30;
  raw_sstring_view lhs_view_15;
  Message local_888;
  bool local_879;
  sstringview_maker local_878;
  bool local_861;
  undefined1 local_860 [8];
  AssertionResult gtest_ar_29;
  Message local_848;
  bool local_839;
  sstringview_maker local_838;
  bool local_821;
  undefined1 local_820 [8];
  AssertionResult gtest_ar_28;
  raw_sstring_view lhs_view_14;
  Message local_7f8;
  bool local_7e9;
  sstringview_maker local_7e8;
  bool local_7d1;
  undefined1 local_7d0 [8];
  AssertionResult gtest_ar_27;
  Message local_7b8;
  bool local_7a9;
  sstringview_maker local_7a8;
  bool local_791;
  undefined1 local_790 [8];
  AssertionResult gtest_ar_26;
  raw_sstring_view lhs_view_13;
  Message local_768;
  bool local_759;
  sstringview_maker local_758;
  bool local_741;
  undefined1 local_740 [8];
  AssertionResult gtest_ar_25;
  Message local_728;
  bool local_719;
  sstringview_maker local_718;
  bool local_701;
  undefined1 local_700 [8];
  AssertionResult gtest_ar_24;
  raw_sstring_view lhs_view_12;
  Message local_6d8;
  bool local_6c9;
  sstringview_maker local_6c8;
  bool local_6b1;
  undefined1 local_6b0 [8];
  AssertionResult gtest_ar_23;
  Message local_698;
  bool local_689;
  sstringview_maker local_688;
  bool local_671;
  undefined1 local_670 [8];
  AssertionResult gtest_ar_22;
  raw_sstring_view lhs_view_11;
  Message local_648;
  bool local_639;
  sstringview_maker local_638;
  bool local_621;
  undefined1 local_620 [8];
  AssertionResult gtest_ar_21;
  Message local_608;
  bool local_5f9;
  sstringview_maker local_5f8;
  bool local_5e1;
  undefined1 local_5e0 [8];
  AssertionResult gtest_ar_20;
  raw_sstring_view lhs_view_10;
  Message local_5b8;
  bool local_5a9;
  sstringview_maker local_5a8;
  bool local_591;
  undefined1 local_590 [8];
  AssertionResult gtest_ar_19;
  Message local_578;
  bool local_569;
  sstringview_maker local_568;
  bool local_551;
  undefined1 local_550 [8];
  AssertionResult gtest_ar_18;
  raw_sstring_view lhs_view_9;
  Message local_528;
  bool local_519;
  sstringview_maker local_518;
  bool local_501;
  undefined1 local_500 [8];
  AssertionResult gtest_ar_17;
  Message local_4e8;
  bool local_4d9;
  sstringview_maker local_4d8;
  bool local_4c1;
  undefined1 local_4c0 [8];
  AssertionResult gtest_ar_16;
  raw_sstring_view lhs_view_8;
  Message local_498;
  bool local_489;
  sstringview_maker local_488;
  bool local_471;
  undefined1 local_470 [8];
  AssertionResult gtest_ar_15;
  Message local_458;
  bool local_449;
  sstringview_maker local_448;
  bool local_431;
  undefined1 local_430 [8];
  AssertionResult gtest_ar_14;
  raw_sstring_view lhs_view_7;
  Message local_408;
  bool local_3f9;
  sstringview_maker local_3f8;
  bool local_3e1;
  undefined1 local_3e0 [8];
  AssertionResult gtest_ar_13;
  Message local_3c8;
  bool local_3b9;
  sstringview_maker local_3b8;
  bool local_3a1;
  undefined1 local_3a0 [8];
  AssertionResult gtest_ar_12;
  raw_sstring_view lhs_view_6;
  Message local_378;
  bool local_369;
  sstringview_maker local_368;
  bool local_351;
  undefined1 local_350 [8];
  AssertionResult gtest_ar_11;
  Message local_338;
  bool local_329;
  sstringview_maker local_328;
  bool local_311;
  undefined1 local_310 [8];
  AssertionResult gtest_ar_10;
  raw_sstring_view lhs_view_5;
  Message local_2e8;
  bool local_2d9;
  sstringview_maker local_2d8;
  bool local_2c1;
  undefined1 local_2c0 [8];
  AssertionResult gtest_ar_9;
  Message local_2a8;
  bool local_299;
  sstringview_maker local_298;
  bool local_281;
  undefined1 local_280 [8];
  AssertionResult gtest_ar_8;
  raw_sstring_view lhs_view_4;
  Message local_258;
  bool local_249;
  sstringview_maker local_248;
  bool local_231;
  undefined1 local_230 [8];
  AssertionResult gtest_ar_7;
  Message local_218;
  bool local_209;
  sstringview_maker local_208;
  bool local_1f1;
  undefined1 local_1f0 [8];
  AssertionResult gtest_ar_6;
  raw_sstring_view lhs_view_3;
  Message local_1c8;
  bool local_1b9;
  sstringview_maker local_1b8;
  bool local_1a1;
  undefined1 local_1a0 [8];
  AssertionResult gtest_ar_5;
  Message local_188;
  bool local_179;
  sstringview_maker local_178;
  bool local_161;
  undefined1 local_160 [8];
  AssertionResult gtest_ar_4;
  raw_sstring_view lhs_view_2;
  Message local_138;
  bool local_129;
  sstringview_maker local_128;
  bool local_111;
  undefined1 local_110 [8];
  AssertionResult gtest_ar_3;
  Message local_f8;
  bool local_e9;
  sstringview_maker local_e8;
  bool local_d1;
  undefined1 local_d0 [8];
  AssertionResult gtest_ar_2;
  raw_sstring_view lhs_view_1;
  Message local_a8;
  bool local_99;
  sstringview_maker local_98;
  bool local_81;
  undefined1 local_80 [8];
  AssertionResult gtest_ar_1;
  Message local_58;
  bool local_49;
  sstringview_maker local_48;
  bool local_31;
  undefined1 local_30 [8];
  AssertionResult gtest_ar;
  raw_sstring_view lhs_view;
  SStringViewRelational_Eq_Test<const_(anonymous_namespace)::sstringview_maker> *this_local;
  
  join_0x00000010_0x00000000_ = pstore::make_sstring_view("",0);
  anon_unknown.dwarf_e1429::sstringview_maker::sstringview_maker(&local_48,"");
  local_31 = pstore::operator==((sstring_view<const_char_*> *)&gtest_ar.message_,&local_48);
  local_49 = true;
  testing::internal::EqHelper::Compare<bool,_bool,_nullptr>
            ((EqHelper *)local_30,"lhs_view == (TypeParam (\"\"))","(true)",&local_31,&local_49);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_30);
  if (!bVar1) {
    testing::Message::Message(&local_58);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_30);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/adt/test_sstring_view.cpp"
               ,0x180,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_58);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_58);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_30);
  anon_unknown.dwarf_e1429::sstringview_maker::sstringview_maker(&local_98,"");
  local_81 = pstore::operator==(&local_98,(sstring_view<const_char_*> *)&gtest_ar.message_);
  local_99 = true;
  testing::internal::EqHelper::Compare<bool,_bool,_nullptr>
            ((EqHelper *)local_80,"(TypeParam (\"\")) == lhs_view","(true)",&local_81,&local_99);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_80);
  if (!bVar1) {
    testing::Message::Message(&local_a8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_80);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&lhs_view_1.size_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/adt/test_sstring_view.cpp"
               ,0x180,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&lhs_view_1.size_,&local_a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&lhs_view_1.size_);
    testing::Message::~Message(&local_a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_80);
  join_0x00000010_0x00000000_ = pstore::make_sstring_view("",0);
  anon_unknown.dwarf_e1429::sstringview_maker::sstringview_maker(&local_e8,"abcde");
  local_d1 = pstore::operator==((sstring_view<const_char_*> *)&gtest_ar_2.message_,&local_e8);
  local_e9 = false;
  testing::internal::EqHelper::Compare<bool,_bool,_nullptr>
            ((EqHelper *)local_d0,"lhs_view == (TypeParam (\"abcde\"))","(false)",&local_d1,
             &local_e9);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d0);
  if (!bVar1) {
    testing::Message::Message(&local_f8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_d0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/adt/test_sstring_view.cpp"
               ,0x181,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_d0);
  anon_unknown.dwarf_e1429::sstringview_maker::sstringview_maker(&local_128,"abcde");
  local_111 = pstore::operator==(&local_128,(sstring_view<const_char_*> *)&gtest_ar_2.message_);
  local_129 = false;
  testing::internal::EqHelper::Compare<bool,_bool,_nullptr>
            ((EqHelper *)local_110,"(TypeParam (\"abcde\")) == lhs_view","(false)",&local_111,
             &local_129);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_110);
  if (!bVar1) {
    testing::Message::Message(&local_138);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_110);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&lhs_view_2.size_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/adt/test_sstring_view.cpp"
               ,0x181,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&lhs_view_2.size_,&local_138);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&lhs_view_2.size_);
    testing::Message::~Message(&local_138);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_110);
  join_0x00000010_0x00000000_ = pstore::make_sstring_view("",0);
  anon_unknown.dwarf_e1429::sstringview_maker::sstringview_maker(&local_178,"abcdefghij");
  local_161 = pstore::operator==((sstring_view<const_char_*> *)&gtest_ar_4.message_,&local_178);
  local_179 = false;
  testing::internal::EqHelper::Compare<bool,_bool,_nullptr>
            ((EqHelper *)local_160,"lhs_view == (TypeParam (\"abcdefghij\"))","(false)",&local_161,
             &local_179);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_160);
  if (!bVar1) {
    testing::Message::Message(&local_188);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_160);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/adt/test_sstring_view.cpp"
               ,0x182,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_188);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(&local_188);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_160);
  anon_unknown.dwarf_e1429::sstringview_maker::sstringview_maker(&local_1b8,"abcdefghij");
  local_1a1 = pstore::operator==(&local_1b8,(sstring_view<const_char_*> *)&gtest_ar_4.message_);
  local_1b9 = false;
  testing::internal::EqHelper::Compare<bool,_bool,_nullptr>
            ((EqHelper *)local_1a0,"(TypeParam (\"abcdefghij\")) == lhs_view","(false)",&local_1a1,
             &local_1b9);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1a0);
  if (!bVar1) {
    testing::Message::Message(&local_1c8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1a0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&lhs_view_3.size_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/adt/test_sstring_view.cpp"
               ,0x182,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&lhs_view_3.size_,&local_1c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&lhs_view_3.size_);
    testing::Message::~Message(&local_1c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1a0);
  join_0x00000010_0x00000000_ = pstore::make_sstring_view("",0);
  anon_unknown.dwarf_e1429::sstringview_maker::sstringview_maker(&local_208,"abcdefghijklmnopqrst");
  local_1f1 = pstore::operator==((sstring_view<const_char_*> *)&gtest_ar_6.message_,&local_208);
  local_209 = false;
  testing::internal::EqHelper::Compare<bool,_bool,_nullptr>
            ((EqHelper *)local_1f0,"lhs_view == (TypeParam (\"abcdefghijklmnopqrst\"))","(false)",
             &local_1f1,&local_209);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1f0);
  if (!bVar1) {
    testing::Message::Message(&local_218);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1f0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/adt/test_sstring_view.cpp"
               ,0x183,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7.message_,&local_218);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
    testing::Message::~Message(&local_218);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1f0);
  anon_unknown.dwarf_e1429::sstringview_maker::sstringview_maker(&local_248,"abcdefghijklmnopqrst");
  local_231 = pstore::operator==(&local_248,(sstring_view<const_char_*> *)&gtest_ar_6.message_);
  local_249 = false;
  testing::internal::EqHelper::Compare<bool,_bool,_nullptr>
            ((EqHelper *)local_230,"(TypeParam (\"abcdefghijklmnopqrst\")) == lhs_view","(false)",
             &local_231,&local_249);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_230);
  if (!bVar1) {
    testing::Message::Message(&local_258);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_230);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&lhs_view_4.size_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/adt/test_sstring_view.cpp"
               ,0x183,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&lhs_view_4.size_,&local_258);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&lhs_view_4.size_);
    testing::Message::~Message(&local_258);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_230);
  join_0x00000010_0x00000000_ = pstore::make_sstring_view("abcde",5);
  anon_unknown.dwarf_e1429::sstringview_maker::sstringview_maker(&local_298,"");
  local_281 = pstore::operator==((sstring_view<const_char_*> *)&gtest_ar_8.message_,&local_298);
  local_299 = false;
  testing::internal::EqHelper::Compare<bool,_bool,_nullptr>
            ((EqHelper *)local_280,"lhs_view == (TypeParam (\"\"))","(false)",&local_281,&local_299)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_280);
  if (!bVar1) {
    testing::Message::Message(&local_2a8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_280);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_9.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/adt/test_sstring_view.cpp"
               ,0x184,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_9.message_,&local_2a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_9.message_);
    testing::Message::~Message(&local_2a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_280);
  anon_unknown.dwarf_e1429::sstringview_maker::sstringview_maker(&local_2d8,"");
  local_2c1 = pstore::operator==(&local_2d8,(sstring_view<const_char_*> *)&gtest_ar_8.message_);
  local_2d9 = false;
  testing::internal::EqHelper::Compare<bool,_bool,_nullptr>
            ((EqHelper *)local_2c0,"(TypeParam (\"\")) == lhs_view","(false)",&local_2c1,&local_2d9)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2c0);
  if (!bVar1) {
    testing::Message::Message(&local_2e8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_2c0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&lhs_view_5.size_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/adt/test_sstring_view.cpp"
               ,0x184,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&lhs_view_5.size_,&local_2e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&lhs_view_5.size_);
    testing::Message::~Message(&local_2e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2c0);
  join_0x00000010_0x00000000_ = pstore::make_sstring_view("abcde",5);
  anon_unknown.dwarf_e1429::sstringview_maker::sstringview_maker(&local_328,"abcde");
  local_311 = pstore::operator==((sstring_view<const_char_*> *)&gtest_ar_10.message_,&local_328);
  local_329 = true;
  testing::internal::EqHelper::Compare<bool,_bool,_nullptr>
            ((EqHelper *)local_310,"lhs_view == (TypeParam (\"abcde\"))","(true)",&local_311,
             &local_329);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_310);
  if (!bVar1) {
    testing::Message::Message(&local_338);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_310);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_11.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/adt/test_sstring_view.cpp"
               ,0x185,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_11.message_,&local_338);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_11.message_);
    testing::Message::~Message(&local_338);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_310);
  anon_unknown.dwarf_e1429::sstringview_maker::sstringview_maker(&local_368,"abcde");
  local_351 = pstore::operator==(&local_368,(sstring_view<const_char_*> *)&gtest_ar_10.message_);
  local_369 = true;
  testing::internal::EqHelper::Compare<bool,_bool,_nullptr>
            ((EqHelper *)local_350,"(TypeParam (\"abcde\")) == lhs_view","(true)",&local_351,
             &local_369);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_350);
  if (!bVar1) {
    testing::Message::Message(&local_378);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_350);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&lhs_view_6.size_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/adt/test_sstring_view.cpp"
               ,0x185,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&lhs_view_6.size_,&local_378);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&lhs_view_6.size_);
    testing::Message::~Message(&local_378);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_350);
  join_0x00000010_0x00000000_ = pstore::make_sstring_view("abcde",5);
  anon_unknown.dwarf_e1429::sstringview_maker::sstringview_maker(&local_3b8,"abcdefghij");
  local_3a1 = pstore::operator==((sstring_view<const_char_*> *)&gtest_ar_12.message_,&local_3b8);
  local_3b9 = false;
  testing::internal::EqHelper::Compare<bool,_bool,_nullptr>
            ((EqHelper *)local_3a0,"lhs_view == (TypeParam (\"abcdefghij\"))","(false)",&local_3a1,
             &local_3b9);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3a0);
  if (!bVar1) {
    testing::Message::Message(&local_3c8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_3a0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_13.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/adt/test_sstring_view.cpp"
               ,0x186,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_13.message_,&local_3c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_13.message_);
    testing::Message::~Message(&local_3c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3a0);
  anon_unknown.dwarf_e1429::sstringview_maker::sstringview_maker(&local_3f8,"abcdefghij");
  local_3e1 = pstore::operator==(&local_3f8,(sstring_view<const_char_*> *)&gtest_ar_12.message_);
  local_3f9 = false;
  testing::internal::EqHelper::Compare<bool,_bool,_nullptr>
            ((EqHelper *)local_3e0,"(TypeParam (\"abcdefghij\")) == lhs_view","(false)",&local_3e1,
             &local_3f9);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3e0);
  if (!bVar1) {
    testing::Message::Message(&local_408);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_3e0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&lhs_view_7.size_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/adt/test_sstring_view.cpp"
               ,0x186,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&lhs_view_7.size_,&local_408);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&lhs_view_7.size_);
    testing::Message::~Message(&local_408);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3e0);
  join_0x00000010_0x00000000_ = pstore::make_sstring_view("abcde",5);
  anon_unknown.dwarf_e1429::sstringview_maker::sstringview_maker(&local_448,"abcdefghijklmnopqrst");
  local_431 = pstore::operator==((sstring_view<const_char_*> *)&gtest_ar_14.message_,&local_448);
  local_449 = false;
  testing::internal::EqHelper::Compare<bool,_bool,_nullptr>
            ((EqHelper *)local_430,"lhs_view == (TypeParam (\"abcdefghijklmnopqrst\"))","(false)",
             &local_431,&local_449);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_430);
  if (!bVar1) {
    testing::Message::Message(&local_458);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_430);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_15.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/adt/test_sstring_view.cpp"
               ,0x187,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_15.message_,&local_458);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_15.message_);
    testing::Message::~Message(&local_458);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_430);
  anon_unknown.dwarf_e1429::sstringview_maker::sstringview_maker(&local_488,"abcdefghijklmnopqrst");
  local_471 = pstore::operator==(&local_488,(sstring_view<const_char_*> *)&gtest_ar_14.message_);
  local_489 = false;
  testing::internal::EqHelper::Compare<bool,_bool,_nullptr>
            ((EqHelper *)local_470,"(TypeParam (\"abcdefghijklmnopqrst\")) == lhs_view","(false)",
             &local_471,&local_489);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_470);
  if (!bVar1) {
    testing::Message::Message(&local_498);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_470);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&lhs_view_8.size_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/adt/test_sstring_view.cpp"
               ,0x187,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&lhs_view_8.size_,&local_498);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&lhs_view_8.size_);
    testing::Message::~Message(&local_498);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_470);
  join_0x00000010_0x00000000_ = pstore::make_sstring_view("abcdefghij",10);
  anon_unknown.dwarf_e1429::sstringview_maker::sstringview_maker(&local_4d8,"");
  local_4c1 = pstore::operator==((sstring_view<const_char_*> *)&gtest_ar_16.message_,&local_4d8);
  local_4d9 = false;
  testing::internal::EqHelper::Compare<bool,_bool,_nullptr>
            ((EqHelper *)local_4c0,"lhs_view == (TypeParam (\"\"))","(false)",&local_4c1,&local_4d9)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4c0);
  if (!bVar1) {
    testing::Message::Message(&local_4e8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_4c0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_17.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/adt/test_sstring_view.cpp"
               ,0x188,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_17.message_,&local_4e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_17.message_);
    testing::Message::~Message(&local_4e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4c0);
  anon_unknown.dwarf_e1429::sstringview_maker::sstringview_maker(&local_518,"");
  local_501 = pstore::operator==(&local_518,(sstring_view<const_char_*> *)&gtest_ar_16.message_);
  local_519 = false;
  testing::internal::EqHelper::Compare<bool,_bool,_nullptr>
            ((EqHelper *)local_500,"(TypeParam (\"\")) == lhs_view","(false)",&local_501,&local_519)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_500);
  if (!bVar1) {
    testing::Message::Message(&local_528);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_500);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&lhs_view_9.size_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/adt/test_sstring_view.cpp"
               ,0x188,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&lhs_view_9.size_,&local_528);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&lhs_view_9.size_);
    testing::Message::~Message(&local_528);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_500);
  join_0x00000010_0x00000000_ = pstore::make_sstring_view("abcdefghij",10);
  anon_unknown.dwarf_e1429::sstringview_maker::sstringview_maker(&local_568,"abcde");
  local_551 = pstore::operator==((sstring_view<const_char_*> *)&gtest_ar_18.message_,&local_568);
  local_569 = false;
  testing::internal::EqHelper::Compare<bool,_bool,_nullptr>
            ((EqHelper *)local_550,"lhs_view == (TypeParam (\"abcde\"))","(false)",&local_551,
             &local_569);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_550);
  if (!bVar1) {
    testing::Message::Message(&local_578);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_550);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_19.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/adt/test_sstring_view.cpp"
               ,0x189,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_19.message_,&local_578);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_19.message_);
    testing::Message::~Message(&local_578);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_550);
  anon_unknown.dwarf_e1429::sstringview_maker::sstringview_maker(&local_5a8,"abcde");
  local_591 = pstore::operator==(&local_5a8,(sstring_view<const_char_*> *)&gtest_ar_18.message_);
  local_5a9 = false;
  testing::internal::EqHelper::Compare<bool,_bool,_nullptr>
            ((EqHelper *)local_590,"(TypeParam (\"abcde\")) == lhs_view","(false)",&local_591,
             &local_5a9);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_590);
  if (!bVar1) {
    testing::Message::Message(&local_5b8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_590);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&lhs_view_10.size_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/adt/test_sstring_view.cpp"
               ,0x189,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&lhs_view_10.size_,&local_5b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&lhs_view_10.size_);
    testing::Message::~Message(&local_5b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_590);
  join_0x00000010_0x00000000_ = pstore::make_sstring_view("abcdefghij",10);
  anon_unknown.dwarf_e1429::sstringview_maker::sstringview_maker(&local_5f8,"abcdefghij");
  local_5e1 = pstore::operator==((sstring_view<const_char_*> *)&gtest_ar_20.message_,&local_5f8);
  local_5f9 = true;
  testing::internal::EqHelper::Compare<bool,_bool,_nullptr>
            ((EqHelper *)local_5e0,"lhs_view == (TypeParam (\"abcdefghij\"))","(true)",&local_5e1,
             &local_5f9);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_5e0);
  if (!bVar1) {
    testing::Message::Message(&local_608);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_5e0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_21.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/adt/test_sstring_view.cpp"
               ,0x18a,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_21.message_,&local_608);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_21.message_);
    testing::Message::~Message(&local_608);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_5e0);
  anon_unknown.dwarf_e1429::sstringview_maker::sstringview_maker(&local_638,"abcdefghij");
  local_621 = pstore::operator==(&local_638,(sstring_view<const_char_*> *)&gtest_ar_20.message_);
  local_639 = true;
  testing::internal::EqHelper::Compare<bool,_bool,_nullptr>
            ((EqHelper *)local_620,"(TypeParam (\"abcdefghij\")) == lhs_view","(true)",&local_621,
             &local_639);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_620);
  if (!bVar1) {
    testing::Message::Message(&local_648);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_620);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&lhs_view_11.size_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/adt/test_sstring_view.cpp"
               ,0x18a,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&lhs_view_11.size_,&local_648);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&lhs_view_11.size_);
    testing::Message::~Message(&local_648);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_620);
  join_0x00000010_0x00000000_ = pstore::make_sstring_view("abcdefghij",10);
  anon_unknown.dwarf_e1429::sstringview_maker::sstringview_maker(&local_688,"abcdefghijklmnopqrst");
  local_671 = pstore::operator==((sstring_view<const_char_*> *)&gtest_ar_22.message_,&local_688);
  local_689 = false;
  testing::internal::EqHelper::Compare<bool,_bool,_nullptr>
            ((EqHelper *)local_670,"lhs_view == (TypeParam (\"abcdefghijklmnopqrst\"))","(false)",
             &local_671,&local_689);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_670);
  if (!bVar1) {
    testing::Message::Message(&local_698);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_670);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_23.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/adt/test_sstring_view.cpp"
               ,0x18b,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_23.message_,&local_698);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_23.message_);
    testing::Message::~Message(&local_698);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_670);
  anon_unknown.dwarf_e1429::sstringview_maker::sstringview_maker(&local_6c8,"abcdefghijklmnopqrst");
  local_6b1 = pstore::operator==(&local_6c8,(sstring_view<const_char_*> *)&gtest_ar_22.message_);
  local_6c9 = false;
  testing::internal::EqHelper::Compare<bool,_bool,_nullptr>
            ((EqHelper *)local_6b0,"(TypeParam (\"abcdefghijklmnopqrst\")) == lhs_view","(false)",
             &local_6b1,&local_6c9);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_6b0);
  if (!bVar1) {
    testing::Message::Message(&local_6d8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_6b0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&lhs_view_12.size_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/adt/test_sstring_view.cpp"
               ,0x18b,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&lhs_view_12.size_,&local_6d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&lhs_view_12.size_);
    testing::Message::~Message(&local_6d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_6b0);
  join_0x00000010_0x00000000_ = pstore::make_sstring_view("abcdefghijklmnopqrst",0x14);
  anon_unknown.dwarf_e1429::sstringview_maker::sstringview_maker(&local_718,"");
  local_701 = pstore::operator==((sstring_view<const_char_*> *)&gtest_ar_24.message_,&local_718);
  local_719 = false;
  testing::internal::EqHelper::Compare<bool,_bool,_nullptr>
            ((EqHelper *)local_700,"lhs_view == (TypeParam (\"\"))","(false)",&local_701,&local_719)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_700);
  if (!bVar1) {
    testing::Message::Message(&local_728);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_700);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_25.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/adt/test_sstring_view.cpp"
               ,0x18c,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_25.message_,&local_728);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_25.message_);
    testing::Message::~Message(&local_728);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_700);
  anon_unknown.dwarf_e1429::sstringview_maker::sstringview_maker(&local_758,"");
  local_741 = pstore::operator==(&local_758,(sstring_view<const_char_*> *)&gtest_ar_24.message_);
  local_759 = false;
  testing::internal::EqHelper::Compare<bool,_bool,_nullptr>
            ((EqHelper *)local_740,"(TypeParam (\"\")) == lhs_view","(false)",&local_741,&local_759)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_740);
  if (!bVar1) {
    testing::Message::Message(&local_768);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_740);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&lhs_view_13.size_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/adt/test_sstring_view.cpp"
               ,0x18c,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&lhs_view_13.size_,&local_768);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&lhs_view_13.size_);
    testing::Message::~Message(&local_768);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_740);
  join_0x00000010_0x00000000_ = pstore::make_sstring_view("abcdefghijklmnopqrst",0x14);
  anon_unknown.dwarf_e1429::sstringview_maker::sstringview_maker(&local_7a8,"abcde");
  local_791 = pstore::operator==((sstring_view<const_char_*> *)&gtest_ar_26.message_,&local_7a8);
  local_7a9 = false;
  testing::internal::EqHelper::Compare<bool,_bool,_nullptr>
            ((EqHelper *)local_790,"lhs_view == (TypeParam (\"abcde\"))","(false)",&local_791,
             &local_7a9);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_790);
  if (!bVar1) {
    testing::Message::Message(&local_7b8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_790);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_27.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/adt/test_sstring_view.cpp"
               ,0x18d,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_27.message_,&local_7b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_27.message_);
    testing::Message::~Message(&local_7b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_790);
  anon_unknown.dwarf_e1429::sstringview_maker::sstringview_maker(&local_7e8,"abcde");
  local_7d1 = pstore::operator==(&local_7e8,(sstring_view<const_char_*> *)&gtest_ar_26.message_);
  local_7e9 = false;
  testing::internal::EqHelper::Compare<bool,_bool,_nullptr>
            ((EqHelper *)local_7d0,"(TypeParam (\"abcde\")) == lhs_view","(false)",&local_7d1,
             &local_7e9);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_7d0);
  if (!bVar1) {
    testing::Message::Message(&local_7f8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_7d0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&lhs_view_14.size_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/adt/test_sstring_view.cpp"
               ,0x18d,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&lhs_view_14.size_,&local_7f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&lhs_view_14.size_);
    testing::Message::~Message(&local_7f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_7d0);
  join_0x00000010_0x00000000_ = pstore::make_sstring_view("abcdefghijklmnopqrst",0x14);
  anon_unknown.dwarf_e1429::sstringview_maker::sstringview_maker(&local_838,"abcdefghij");
  local_821 = pstore::operator==((sstring_view<const_char_*> *)&gtest_ar_28.message_,&local_838);
  local_839 = false;
  testing::internal::EqHelper::Compare<bool,_bool,_nullptr>
            ((EqHelper *)local_820,"lhs_view == (TypeParam (\"abcdefghij\"))","(false)",&local_821,
             &local_839);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_820);
  if (!bVar1) {
    testing::Message::Message(&local_848);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_820);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_29.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/adt/test_sstring_view.cpp"
               ,0x18e,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_29.message_,&local_848);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_29.message_);
    testing::Message::~Message(&local_848);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_820);
  anon_unknown.dwarf_e1429::sstringview_maker::sstringview_maker(&local_878,"abcdefghij");
  local_861 = pstore::operator==(&local_878,(sstring_view<const_char_*> *)&gtest_ar_28.message_);
  local_879 = false;
  testing::internal::EqHelper::Compare<bool,_bool,_nullptr>
            ((EqHelper *)local_860,"(TypeParam (\"abcdefghij\")) == lhs_view","(false)",&local_861,
             &local_879);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_860);
  if (!bVar1) {
    testing::Message::Message(&local_888);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_860);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&lhs_view_15.size_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/adt/test_sstring_view.cpp"
               ,0x18e,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&lhs_view_15.size_,&local_888);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&lhs_view_15.size_);
    testing::Message::~Message(&local_888);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_860);
  join_0x00000010_0x00000000_ = pstore::make_sstring_view("abcdefghijklmnopqrst",0x14);
  anon_unknown.dwarf_e1429::sstringview_maker::sstringview_maker(&local_8c8,"abcdefghijklmnopqrst");
  local_8b1 = pstore::operator==((sstring_view<const_char_*> *)&gtest_ar_30.message_,&local_8c8);
  local_8c9 = true;
  testing::internal::EqHelper::Compare<bool,_bool,_nullptr>
            ((EqHelper *)local_8b0,"lhs_view == (TypeParam (\"abcdefghijklmnopqrst\"))","(true)",
             &local_8b1,&local_8c9);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_8b0);
  if (!bVar1) {
    testing::Message::Message(&local_8d8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_8b0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_31.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/adt/test_sstring_view.cpp"
               ,399,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_31.message_,&local_8d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_31.message_);
    testing::Message::~Message(&local_8d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_8b0);
  anon_unknown.dwarf_e1429::sstringview_maker::sstringview_maker(&local_908,"abcdefghijklmnopqrst");
  local_8f1 = pstore::operator==(&local_908,(sstring_view<const_char_*> *)&gtest_ar_30.message_);
  local_909 = true;
  testing::internal::EqHelper::Compare<bool,_bool,_nullptr>
            ((EqHelper *)local_8f0,"(TypeParam (\"abcdefghijklmnopqrst\")) == lhs_view","(true)",
             &local_8f1,&local_909);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_8f0);
  if (!bVar1) {
    testing::Message::Message(&local_918);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_8f0);
    testing::internal::AssertHelper::AssertHelper
              (&local_920,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/adt/test_sstring_view.cpp"
               ,399,pcVar2);
    testing::internal::AssertHelper::operator=(&local_920,&local_918);
    testing::internal::AssertHelper::~AssertHelper(&local_920);
    testing::Message::~Message(&local_918);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_8f0);
  return;
}

Assistant:

TYPED_TEST (SStringViewRelational, Eq) {
#define EQ(lhs, rhs, x)                                                                            \
    do {                                                                                           \
        auto const lhs_view = pstore::make_sstring_view ((lhs), std::strlen (lhs));                \
        EXPECT_EQ (lhs_view == (rhs), (x));                                                        \
        EXPECT_EQ ((rhs) == lhs_view, (x));                                                        \
    } while (0)
    EQ ("", TypeParam (""), true);
    EQ ("", TypeParam ("abcde"), false);
    EQ ("", TypeParam ("abcdefghij"), false);
    EQ ("", TypeParam ("abcdefghijklmnopqrst"), false);
    EQ ("abcde", TypeParam (""), false);
    EQ ("abcde", TypeParam ("abcde"), true);
    EQ ("abcde", TypeParam ("abcdefghij"), false);
    EQ ("abcde", TypeParam ("abcdefghijklmnopqrst"), false);
    EQ ("abcdefghij", TypeParam (""), false);
    EQ ("abcdefghij", TypeParam ("abcde"), false);
    EQ ("abcdefghij", TypeParam ("abcdefghij"), true);
    EQ ("abcdefghij", TypeParam ("abcdefghijklmnopqrst"), false);
    EQ ("abcdefghijklmnopqrst", TypeParam (""), false);
    EQ ("abcdefghijklmnopqrst", TypeParam ("abcde"), false);
    EQ ("abcdefghijklmnopqrst", TypeParam ("abcdefghij"), false);
    EQ ("abcdefghijklmnopqrst", TypeParam ("abcdefghijklmnopqrst"), true);
#undef EQ
}